

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTest.cpp
# Opt level: O1

void writeUData(XMLCh *s)

{
  short *psVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  puts("<udata>");
  uVar4 = 0;
  if (s != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)s + uVar4);
      uVar4 = uVar4 + 2;
    } while (*psVar1 != 0);
    uVar4 = ((long)uVar4 >> 1) - 1;
  }
  if (uVar4 != 0) {
    uVar2 = 1;
    uVar3 = 0;
    do {
      if ((uVar2 - 1 & 0xf) == 0) {
        putchar(10);
      }
      printf("%4x ",(ulong)(ushort)s[uVar3]);
      uVar3 = (ulong)uVar2;
      uVar2 = uVar2 + 1;
    } while (uVar3 < uVar4);
  }
  puts("\n</udata>");
  return;
}

Assistant:

static void writeUData(const XMLCh* s)
{
    unsigned int i;
    printf("<udata>\n");
    size_t len = XMLString::stringLen(s);
    for (i=0; i<len; i++)
    {
        if (i % 16 == 0)
            printf("\n");
        XMLCh c = s[i];
        printf("%4x ", c);
    }
    printf("\n</udata>\n");
}